

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          char *substr)

{
  TestPartResultArray *this;
  void *__dest;
  TestPartResult *pTVar1;
  size_t sVar2;
  scoped_ptr<testing::internal::String> extraout_RDX;
  size_t i;
  long lVar3;
  size_t sVar4;
  int index;
  ostream *poVar5;
  ostream *this_00;
  undefined4 in_register_00000084;
  Type TVar6;
  char *pcVar7;
  Message MVar8;
  AssertionResult AVar9;
  Message msg;
  Message local_50;
  char local_43;
  char local_42;
  char local_41;
  void *local_40;
  testing *local_38;
  
  TVar6 = (Type)substr;
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar7 = "1 non-fatal failure";
  if (TVar6 == kFatalFailure) {
    pcVar7 = "1 fatal failure";
  }
  lVar3 = (ulong)(TVar6 != kFatalFailure) * 4;
  sVar2 = lVar3 + 0xf;
  local_38 = (testing *)param_1;
  __dest = operator_new__(lVar3 + 0x10);
  memcpy(__dest,pcVar7,sVar2);
  *(undefined1 *)((long)__dest + lVar3 + 0xf) = 0;
  local_40 = __dest;
  Message::Message(&local_50);
  if ((*(long *)(this + 8) - *(long *)this & 0x3fffffffc0U) == 0x40) {
    pTVar1 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar1->type_ == TVar6) {
      pcVar7 = strstr((pTVar1->message_).c_str_,(char *)msg.ss_);
      if (pcVar7 != (char *)0x0) {
        *local_38 = (testing)0x1;
        *(undefined8 *)(local_38 + 8) = 0;
        goto LAB_0014e054;
      }
      poVar5 = (ostream *)(local_50.ss_ + 0x10);
      if (local_50.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected: ",10);
      poVar5 = (ostream *)(local_50.ss_ + 0x10);
      if (local_50.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      sVar4 = 0;
      do {
        if (*(char *)((long)local_40 + sVar4) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
        }
        else {
          local_41 = *(char *)((long)local_40 + sVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_41,1);
        }
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
      poVar5 = (ostream *)(local_50.ss_ + 0x10);
      if (local_50.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," containing \"",0xd);
      if (msg.ss_ == (StrStream *)0x0) {
        MVar8.ss_ = local_50.ss_ + 0x10;
        sVar2 = 6;
        msg.ss_ = (StrStream *)"(null)";
      }
      else {
        MVar8.ss_ = local_50.ss_;
        if (local_50.ss_ != (StrStream *)0x0) {
          MVar8.ss_ = (StrStream *)(local_50.ss_ + 0x10);
        }
        sVar2 = strlen((char *)msg.ss_);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar8.ss_,(char *)msg.ss_,sVar2)
      ;
      poVar5 = (ostream *)(local_50.ss_ + 0x10);
      if (local_50.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
    }
    else {
      poVar5 = (ostream *)(local_50.ss_ + 0x10);
      if (local_50.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected: ",10);
      poVar5 = (ostream *)(local_50.ss_ + 0x10);
      if (local_50.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      sVar4 = 0;
      do {
        if (*(char *)((long)local_40 + sVar4) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
        }
        else {
          local_42 = *(char *)((long)local_40 + sVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_42,1);
        }
        sVar4 = sVar4 + 1;
      } while (sVar2 != sVar4);
      poVar5 = (ostream *)(local_50.ss_ + 0x10);
      if (local_50.ss_ == (StrStream *)0x0) {
        poVar5 = (ostream *)0x0;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    }
    poVar5 = (ostream *)(local_50.ss_ + 0x10);
    if (local_50.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Actual:\n",10);
    poVar5 = (ostream *)(local_50.ss_ + 0x10);
    if (local_50.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    testing::operator<<(poVar5,pTVar1);
    AssertionFailure(local_38,&local_50);
  }
  else {
    poVar5 = (ostream *)(local_50.ss_ + 0x10);
    if (local_50.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected: ",10);
    poVar5 = (ostream *)(local_50.ss_ + 0x10);
    if (local_50.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    sVar4 = 0;
    do {
      if (*(char *)((long)local_40 + sVar4) == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
      }
      else {
        local_43 = *(char *)((long)local_40 + sVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_43,1);
      }
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
    poVar5 = (ostream *)(local_50.ss_ + 0x10);
    if (local_50.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    poVar5 = (ostream *)(local_50.ss_ + 0x10);
    if (local_50.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Actual: ",10);
    this_00 = (ostream *)(local_50.ss_ + 0x10);
    if (local_50.ss_ == (StrStream *)0x0) {
      this_00 = (ostream *)0x0;
    }
    std::ostream::operator<<(this_00,(int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    poVar5 = (ostream *)(local_50.ss_ + 0x10);
    if (local_50.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," failures",9);
    if (0 < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6)) {
      index = 0;
      do {
        poVar5 = (ostream *)(local_50.ss_ + 0x10);
        if (local_50.ss_ == (StrStream *)0x0) {
          poVar5 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        pTVar1 = TestPartResultArray::GetTestPartResult(this,index);
        poVar5 = (ostream *)(local_50.ss_ + 0x10);
        if (local_50.ss_ == (StrStream *)0x0) {
          poVar5 = (ostream *)0x0;
        }
        testing::operator<<(poVar5,pTVar1);
        index = index + 1;
      } while (index < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    }
    AssertionFailure(local_38,&local_50);
  }
LAB_0014e054:
  if (local_50.ss_ != (StrStream *)0x0) {
    (**(code **)(*(long *)local_50.ss_ + 8))();
  }
  operator_delete__(local_40);
  AVar9.message_.ptr_ = extraout_RDX.ptr_;
  AVar9._0_8_ = local_38;
  return AVar9;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const char* substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure(msg);
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    msg << "Expected: " << expected << "\n"
        << "  Actual:\n"
        << r;
    return AssertionFailure(msg);
  }

  if (strstr(r.message(), substr) == NULL) {
    msg << "Expected: " << expected << " containing \""
        << substr << "\"\n"
        << "  Actual:\n"
        << r;
    return AssertionFailure(msg);
  }

  return AssertionSuccess();
}